

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  LY_ERR LVar1;
  char *pcVar2;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  uint32_t depth_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  LVar1 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NONE);
  if (LVar1 != LY_SUCCESS) {
    return LY_EVALID;
  }
  switch(exp->tokens[*tok_idx]) {
  case LYXP_TOKEN_PAR1:
    *tok_idx = *tok_idx + 1;
    LVar1 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_PAR2);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    *tok_idx = *tok_idx + 1;
    break;
  default:
    pcVar2 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar2,
            exp->expr + exp->tok_pos[*tok_idx]);
    return LY_EVALID;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
  case LYXP_TOKEN_AXISNAME:
    LVar1 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
    goto joined_r0x00215084;
  case LYXP_TOKEN_VARREF:
    *tok_idx = *tok_idx + 1;
    break;
  case LYXP_TOKEN_FUNCNAME:
    LVar1 = reparse_function_call(ctx,exp,tok_idx,depth);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    break;
  case LYXP_TOKEN_OPER_PATH:
  case LYXP_TOKEN_OPER_RPATH:
    LVar1 = reparse_absolute_location_path(ctx,exp,tok_idx,depth);
joined_r0x00215084:
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    return LY_SUCCESS;
  case LYXP_TOKEN_LITERAL:
    *tok_idx = *tok_idx + 1;
    break;
  case LYXP_TOKEN_NUMBER:
    *tok_idx = *tok_idx + 1;
  }
  do {
    LVar1 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_BRACK1);
    if (LVar1 != LY_SUCCESS) {
      LVar1 = exp_check_token2((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_OPER_PATH,LYXP_TOKEN_OPER_RPATH
                              );
      if (LVar1 == LY_SUCCESS) {
        *tok_idx = *tok_idx + 1;
        LVar1 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
      return LY_SUCCESS;
    }
    LVar1 = reparse_predicate(ctx,exp,tok_idx,depth);
  } while (LVar1 == LY_SUCCESS);
  return LVar1;
}

Assistant:

static LY_ERR
reparse_path_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    LY_ERR rc;

    if (lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NONE)) {
        return LY_EVALID;
    }

    switch (exp->tokens[*tok_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*tok_idx);

        rc = reparse_or_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);

        rc = lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_PAR2);
        LY_CHECK_RET(rc);
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AXISNAME:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_VARREF:
        /* VariableReference */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        rc = reparse_function_call(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        goto predicate;
    case LYXP_TOKEN_OPER_PATH:
    case LYXP_TOKEN_OPER_RPATH:
        /* AbsoluteLocationPath */
        rc = reparse_absolute_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*tok_idx);
        goto predicate;
    default:
        LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), &exp->expr[exp->tok_pos[*tok_idx]]);
        return LY_EVALID;
    }

    return LY_SUCCESS;

predicate:
    /* Predicate* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_BRACK1)) {
        rc = reparse_predicate(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    /* ('/' or '//') RelativeLocationPath */
    if (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH)) {

        /* '/' or '//' */
        ++(*tok_idx);

        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}